

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::Print
          (TPZMatrix<std::complex<long_double>_> *this,ostream *out)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  string name;
  allocator<char> local_31;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator(&local_31);
  uVar1 = std::__cxx11::string::c_str();
  (**(code **)(*in_RDI + 0xe0))(in_RDI,uVar1,in_RSI,0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void Print(std::ostream &out) const 
    {
        std::string name = __PRETTY_FUNCTION__;
        Print(name.c_str(),out);
    }